

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_inplace_negation_array0(void)

{
  roaring_bitmap_t *x1;
  uint64_t b;
  
  x1 = roaring_bitmap_create();
  _assert_true((unsigned_long)x1,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xc54);
  roaring_bitmap_flip_inplace(x1,200,500);
  _assert_true((unsigned_long)x1,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xc57);
  b = roaring_bitmap_get_cardinality(x1);
  _assert_int_equal(300,b,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0xc58);
  roaring_bitmap_free(x1);
  return;
}

Assistant:

DEFINE_TEST(test_inplace_negation_array0) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_non_null(r1);

    roaring_bitmap_flip_inplace(r1, 200U, 500U);
    assert_non_null(r1);
    assert_int_equal(300, roaring_bitmap_get_cardinality(r1));

    roaring_bitmap_free(r1);
}